

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_avx2.c
# Opt level: O3

void aom_compute_flow_at_point_avx2
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  uint8_t *puVar17;
  int iVar18;
  undefined1 (*pauVar19) [32];
  int iVar20;
  undefined1 (*pauVar21) [16];
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  int16_t tmp_ [96];
  int16_t dy [64];
  int16_t dx [64];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 auStack_200 [16];
  undefined1 auStack_1f0 [144];
  undefined1 auStack_160 [128];
  undefined1 auStack_e0 [176];
  
  auVar9 = _DAT_0050f300;
  auVar8 = _DAT_0050f2e0;
  uVar10 = (ulong)stride;
  lVar12 = (long)(stride * y + x);
  pauVar21 = (undefined1 (*) [16])(src + lVar12 + -1);
  auVar32._0_16_ =
       ZEXT116(0) * *pauVar21 + ZEXT116(1) * *(undefined1 (*) [16])(src + ~uVar10 + lVar12);
  auVar32._16_16_ = ZEXT116(1) * *pauVar21;
  auVar53 = vpshufb_avx2(auVar32,_DAT_0050f3e0);
  auVar35 = vpunpcklbw_avx2(auVar32,ZEXT1632((undefined1  [16])0x0));
  auVar27 = vpshufb_avx2(auVar32,_DAT_0050f400);
  auVar32 = vpaddw_avx2(auVar27,auVar35);
  auVar53 = vpaddw_avx2(auVar53,auVar53);
  auVar32 = vpaddw_avx2(auVar32,auVar53);
  auVar53 = vpsubw_avx2(auVar35,auVar27);
  lVar12 = uVar10 * 2;
  uVar14 = 0xfffffffffffffffe;
  lVar16 = 0;
  auVar27._16_16_ = _DAT_0050f440;
  auVar27._0_16_ = _DAT_0050f440;
  auVar35._16_16_ = _DAT_0050f450;
  auVar35._0_16_ = _DAT_0050f450;
  do {
    auVar34._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar21 + uVar10 * 2) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar21 + uVar10);
    auVar34._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar21 + uVar10 * 2);
    auVar46 = vpunpcklbw_avx2(auVar34,ZEXT1632((undefined1  [16])0x0));
    auVar54 = vpshufb_avx2(auVar34,auVar27);
    auVar55 = vpshufb_avx2(auVar34,auVar35);
    auVar34 = vpaddw_avx2(auVar55,auVar46);
    auVar54 = vpaddw_avx2(auVar54,auVar54);
    auVar34 = vpaddw_avx2(auVar34,auVar54);
    auVar55 = vpsubw_avx2(auVar46,auVar55);
    auVar54 = vpaddw_avx2(auVar55,auVar53);
    auVar53 = vperm2i128_avx2(auVar53,auVar55,0x21);
    auVar53 = vpaddw_avx2(auVar53,auVar53);
    auVar53 = vpaddw_avx2(auVar54,auVar53);
    auVar32 = vpsubw_avx2(auVar32,auVar34);
    *(undefined1 (*) [32])(auStack_e0 + lVar16) = auVar53;
    *(undefined1 (*) [32])(auStack_160 + lVar16) = auVar32;
    pauVar21 = (undefined1 (*) [16])(*pauVar21 + lVar12);
    uVar14 = uVar14 + 2;
    lVar16 = lVar16 + 0x20;
    auVar32 = auVar34;
    auVar53 = auVar55;
  } while (uVar14 < 6);
  auVar28 = ZEXT1664((undefined1  [16])0x0);
  uVar14 = 0xfffffffffffffffe;
  lVar16 = 0;
  auVar36 = ZEXT1664((undefined1  [16])0x0);
  auVar40 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar32 = *(undefined1 (*) [32])(auStack_e0 + lVar16);
    auVar53 = *(undefined1 (*) [32])(auStack_160 + lVar16);
    auVar27 = vpmaddwd_avx2(auVar32,auVar32);
    auVar27 = vpaddd_avx2(auVar27,auVar40._0_32_);
    auVar40 = ZEXT3264(auVar27);
    auVar32 = vpmaddwd_avx2(auVar32,auVar53);
    auVar32 = vpaddd_avx2(auVar32,auVar36._0_32_);
    auVar36 = ZEXT3264(auVar32);
    auVar53 = vpmaddwd_avx2(auVar53,auVar53);
    auVar53 = vpaddd_avx2(auVar53,auVar28._0_32_);
    auVar28 = ZEXT3264(auVar53);
    uVar14 = uVar14 + 2;
    lVar16 = lVar16 + 0x20;
  } while (uVar14 < 6);
  auVar27 = vphaddd_avx2(auVar27,auVar32);
  auVar32 = vphaddd_avx2(auVar32,auVar53);
  auVar32 = vphaddd_avx2(auVar27,auVar32);
  auVar5 = vpaddd_avx(auVar32._16_16_,auVar32._0_16_);
  auVar5 = vpaddd_avx(auVar5,_DAT_0050e2c0);
  auVar32 = vcvtdq2pd_avx(auVar5);
  auVar5 = vshufpd_avx(auVar32._16_16_,auVar32._16_16_,1);
  auVar6 = vshufpd_avx(auVar32._0_16_,auVar32._0_16_,1);
  dVar41 = 1.0 / (auVar32._0_8_ * auVar5._0_8_ - auVar32._16_8_ * auVar6._0_8_);
  dVar1 = *v;
  iVar20 = 0;
  auVar53._16_16_ = _DAT_0050f460;
  auVar53._0_16_ = _DAT_0050f460;
  auVar54._8_4_ = 0x80;
  auVar54._0_8_ = 0x8000000080;
  auVar54._12_4_ = 0x80;
  auVar54._16_4_ = 0x80;
  auVar54._20_4_ = 0x80;
  auVar54._24_4_ = 0x80;
  auVar54._28_4_ = 0x80;
  auVar55._8_4_ = 0x10000;
  auVar55._0_8_ = 0x1000000010000;
  auVar55._12_4_ = 0x10000;
  auVar55._16_4_ = 0x10000;
  auVar55._20_4_ = 0x10000;
  auVar55._24_4_ = 0x10000;
  auVar55._28_4_ = 0x10000;
  do {
    dVar2 = *u;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar2;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar1;
    auVar23 = vunpcklpd_avx(auVar23,auVar42);
    auVar31 = vroundpd_avx(auVar23,9);
    auVar37 = vshufpd_avx(auVar31,auVar31,1);
    auVar23 = vsubpd_avx(auVar23,auVar31);
    dVar1 = auVar23._0_8_;
    auVar48._0_8_ = dVar1 * dVar1;
    dVar4 = auVar23._8_8_;
    auVar48._8_8_ = dVar4 * dVar4;
    auVar43._0_8_ = dVar1 * 0.5;
    auVar43._8_8_ = dVar4 * 0.5;
    auVar23 = vsubpd_avx(auVar48,auVar43);
    auVar56._0_8_ = dVar1 * auVar48._0_8_ * 0.5;
    auVar56._8_8_ = dVar4 * auVar48._8_8_ * 0.5;
    auVar23 = vsubpd_avx(auVar23,auVar56);
    auVar50._0_8_ = dVar1 * auVar48._0_8_ * 1.5;
    auVar50._8_8_ = dVar4 * auVar48._8_8_ * 1.5;
    auVar29._0_8_ = auVar43._0_8_ + auVar48._0_8_ + auVar48._0_8_;
    auVar29._8_8_ = auVar43._8_8_ + auVar48._8_8_ + auVar48._8_8_;
    auVar29 = vsubpd_avx(auVar29,auVar50);
    auVar44._0_8_ = auVar48._0_8_ * 0.5;
    auVar44._8_8_ = auVar48._8_8_ * 0.5;
    auVar42 = vsubpd_avx(auVar56,auVar44);
    auVar49._0_8_ = auVar23._0_8_ * 16384.0;
    auVar49._8_8_ = auVar23._8_8_ * 16384.0;
    auVar23 = vroundpd_avx(auVar49,8);
    auVar24._0_8_ = (auVar48._0_8_ * -2.5 + 1.0 + auVar50._0_8_) * 16384.0;
    auVar24._8_8_ = (auVar48._8_8_ * -2.5 + 1.0 + auVar50._8_8_) * 16384.0;
    auVar24 = vroundpd_avx(auVar24,8);
    auVar30._0_8_ = auVar29._0_8_ * 16384.0;
    auVar30._8_8_ = auVar29._8_8_ * 16384.0;
    auVar29 = vroundpd_avx(auVar30,8);
    auVar45._0_8_ = auVar42._0_8_ * 16384.0;
    auVar45._8_8_ = auVar42._8_8_ * 16384.0;
    auVar42 = vroundpd_avx(auVar45,8);
    auVar23 = vcvtpd2dq_avx(auVar23);
    auVar24 = vcvtpd2dq_avx(auVar24);
    auVar29 = vcvtpd2dq_avx(auVar29);
    auVar42 = vcvtpd2dq_avx(auVar42);
    iVar13 = (int)auVar31._0_8_ + x;
    iVar11 = width;
    if (iVar13 < width) {
      iVar11 = iVar13;
    }
    iVar11 = iVar11 + -1;
    iVar15 = (int)auVar37._0_8_ + y;
    iVar18 = height;
    if (iVar15 < height) {
      iVar18 = iVar15;
    }
    auVar23 = vpunpckldq_avx(auVar23,auVar24);
    if (iVar15 < -9) {
      iVar18 = -9;
    }
    auVar24 = vpunpckldq_avx(auVar29,auVar42);
    if (iVar13 < -9) {
      iVar11 = -10;
    }
    auVar23 = vpackssdw_avx(auVar23,auVar24);
    uVar22 = auVar23._0_4_;
    auVar46._4_4_ = uVar22;
    auVar46._0_4_ = uVar22;
    auVar46._8_4_ = uVar22;
    auVar46._12_4_ = uVar22;
    auVar46._16_4_ = uVar22;
    auVar46._20_4_ = uVar22;
    auVar46._24_4_ = uVar22;
    auVar46._28_4_ = uVar22;
    auVar24 = vpackssdw_avx(auVar24,auVar24);
    uVar22 = auVar24._0_4_;
    auVar51._4_4_ = uVar22;
    auVar51._0_4_ = uVar22;
    auVar51._8_4_ = uVar22;
    auVar51._12_4_ = uVar22;
    auVar51._16_4_ = uVar22;
    auVar51._20_4_ = uVar22;
    auVar51._24_4_ = uVar22;
    auVar51._28_4_ = uVar22;
    puVar17 = ref + iVar11;
    lVar16 = -3;
    pauVar19 = (undefined1 (*) [32])local_220;
    do {
      auVar33._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])(puVar17 + (long)iVar18 * uVar10) +
           ZEXT116(1) * *(undefined1 (*) [16])(puVar17 + ((long)iVar18 + -1) * uVar10);
      auVar33._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) * *(undefined1 (*) [16])(puVar17 + (long)iVar18 * uVar10);
      auVar35 = vpunpcklbw_avx2(auVar33,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar34 = vpshufb_avx2(auVar33,auVar53);
      auVar27 = vpshufb_avx2(auVar35,auVar8);
      auVar35 = vpshufb_avx2(auVar35,auVar9);
      auVar27 = vpmaddwd_avx2(auVar27,auVar46);
      auVar35 = vpmaddwd_avx2(auVar35,auVar51);
      auVar27 = vpaddd_avx2(auVar27,auVar35);
      auVar27 = vpaddd_avx2(auVar54,auVar27);
      auVar33 = vpsrad_avx2(auVar27,8);
      auVar27 = vpshufb_avx2(auVar34,auVar8);
      auVar35 = vpshufb_avx2(auVar34,auVar9);
      auVar27 = vpmaddwd_avx2(auVar27,auVar46);
      auVar35 = vpmaddwd_avx2(auVar35,auVar51);
      auVar27 = vpaddd_avx2(auVar27,auVar35);
      auVar27 = vpaddd_avx2(auVar54,auVar27);
      auVar27 = vpsrad_avx2(auVar27,8);
      auVar27 = vpackssdw_avx2(auVar33,auVar27);
      *pauVar19 = auVar27;
      lVar16 = lVar16 + 2;
      pauVar19 = pauVar19 + 1;
      puVar17 = puVar17 + lVar12;
    } while (lVar16 < 8);
    auVar24 = vpshufd_avx(auVar23,0x55);
    uVar22 = auVar24._0_4_;
    auVar47._4_4_ = uVar22;
    auVar47._0_4_ = uVar22;
    auVar47._8_4_ = uVar22;
    auVar47._12_4_ = uVar22;
    auVar47._16_4_ = uVar22;
    auVar47._20_4_ = uVar22;
    auVar47._24_4_ = uVar22;
    auVar47._28_4_ = uVar22;
    auVar23 = vpshufd_avx(auVar23,0xff);
    uVar22 = auVar23._0_4_;
    auVar52._4_4_ = uVar22;
    auVar52._0_4_ = uVar22;
    auVar52._8_4_ = uVar22;
    auVar52._12_4_ = uVar22;
    auVar52._16_4_ = uVar22;
    auVar52._20_4_ = uVar22;
    auVar52._24_4_ = uVar22;
    auVar52._28_4_ = uVar22;
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    uVar14 = 0xfffffffffffffffe;
    lVar16 = 0;
    auVar36 = ZEXT1664((undefined1  [16])0x0);
    puVar17 = src + x;
    do {
      auVar27 = vpunpcklwd_avx2(*(undefined1 (*) [32])(local_220 + lVar16),
                                *(undefined1 (*) [32])(auStack_210 + lVar16));
      auVar27 = vpmaddwd_avx2(auVar27,auVar47);
      auVar35 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_200 + lVar16),
                                *(undefined1 (*) [32])(auStack_1f0 + lVar16));
      auVar35 = vpmaddwd_avx2(auVar35,auVar52);
      auVar27 = vpaddd_avx2(auVar27,auVar35);
      auVar35 = vpunpckhwd_avx2(*(undefined1 (*) [32])(local_220 + lVar16),
                                *(undefined1 (*) [32])(auStack_210 + lVar16));
      auVar35 = vpmaddwd_avx2(auVar35,auVar47);
      auVar34 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_200 + lVar16),
                                *(undefined1 (*) [32])(auStack_1f0 + lVar16));
      auVar34 = vpmaddwd_avx2(auVar34,auVar52);
      auVar35 = vpaddd_avx2(auVar35,auVar34);
      auVar27 = vpaddd_avx2(auVar27,auVar55);
      auVar34 = vpsrad_avx2(auVar27,0x11);
      auVar27 = vpaddd_avx2(auVar55,auVar35);
      auVar27 = vpsrad_avx2(auVar27,0x11);
      auVar27 = vpackssdw_avx2(auVar34,auVar27);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(puVar17 + ((long)y + 1) * uVar10);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(puVar17 + uVar10 * (long)y);
      auVar23 = vpunpcklqdq_avx(auVar37,auVar31);
      auVar35 = vpmovzxbw_avx2(auVar23);
      auVar35 = vpsllw_avx2(auVar35,3);
      auVar35 = vpsubw_avx2(auVar27,auVar35);
      auVar27 = vpmaddwd_avx2(auVar35,*(undefined1 (*) [32])(auStack_e0 + lVar16));
      auVar27 = vpaddd_avx2(auVar27,auVar28._0_32_);
      auVar28 = ZEXT3264(auVar27);
      auVar35 = vpmaddwd_avx2(auVar35,*(undefined1 (*) [32])(auStack_160 + lVar16));
      auVar35 = vpaddd_avx2(auVar35,auVar36._0_32_);
      auVar36 = ZEXT3264(auVar35);
      uVar14 = uVar14 + 2;
      puVar17 = puVar17 + lVar12;
      lVar16 = lVar16 + 0x20;
    } while (uVar14 < 6);
    auVar27 = vphaddd_avx2(auVar27,auVar35);
    auVar23 = vpaddd_avx(auVar27._0_16_,auVar27._16_16_);
    auVar24 = vphaddd_avx(auVar23,auVar23);
    auVar23 = vcvtdq2pd_avx(auVar24);
    auVar24 = vpshufd_avx(auVar24,0xff);
    auVar24 = vcvtdq2pd_avx(auVar24);
    dVar4 = auVar23._0_8_ * auVar5._0_8_ * dVar41 + auVar24._0_8_ * dVar41 * -auVar6._0_8_;
    dVar3 = auVar23._0_8_ * dVar41 * -auVar32._16_8_ + auVar24._0_8_ * auVar32._0_8_ * dVar41;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar4;
    auVar24 = vminsd_avx(ZEXT816(0x4000000000000000),auVar38);
    auVar29 = ZEXT816(0xc000000000000000);
    auVar23 = vcmpsd_avx(auVar38,auVar29,1);
    auVar23 = vblendvpd_avx(auVar24,auVar29,auVar23);
    *u = auVar23._0_8_ + dVar2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar3;
    auVar24 = vminsd_avx(ZEXT816(0x4000000000000000),auVar25);
    auVar23 = vcmpsd_avx(auVar25,auVar29,1);
    auVar23 = vblendvpd_avx(auVar24,auVar29,auVar23);
    dVar1 = auVar23._0_8_ + *v;
    *v = dVar1;
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar4;
    auVar23 = vandpd_avx(auVar39,auVar7);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar3;
    auVar24 = vandpd_avx(auVar26,auVar7);
  } while ((0.125 <= auVar23._0_8_ + auVar24._0_8_) && (iVar20 = iVar20 + 1, iVar20 != 4));
  return;
}

Assistant:

void aom_compute_flow_at_point_avx2(const uint8_t *src, const uint8_t *ref,
                                    int x, int y, int width, int height,
                                    int stride, double *u, double *v) {
  DECLARE_ALIGNED(32, double, M[4]);
  DECLARE_ALIGNED(32, double, M_inv[4]);
  DECLARE_ALIGNED(32, int16_t, dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  DECLARE_ALIGNED(32, int16_t, dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  int b[2];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, dy);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}